

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprAnalyzeAggList(NameContext *pNC,ExprList *pList)

{
  int iVar1;
  ExprList_item *pEVar2;
  Walker local_58;
  
  if ((pList != (ExprList *)0x0) && (0 < pList->nExpr)) {
    pEVar2 = pList->a;
    iVar1 = 0;
    do {
      local_58.pParse = (Parse *)0x0;
      local_58.walkerDepth = 0;
      local_58.bSelectDepthFirst = '\0';
      local_58._29_3_ = 0;
      local_58.xExprCallback = analyzeAggregate;
      local_58.xSelectCallback = analyzeAggregatesInSelect;
      local_58.u.pNC = pNC;
      sqlite3WalkExpr(&local_58,pEVar2->pExpr);
      iVar1 = iVar1 + 1;
      pEVar2 = pEVar2 + 1;
    } while (iVar1 < pList->nExpr);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAnalyzeAggList(NameContext *pNC, ExprList *pList){
  struct ExprList_item *pItem;
  int i;
  if( pList ){
    for(pItem=pList->a, i=0; i<pList->nExpr; i++, pItem++){
      sqlite3ExprAnalyzeAggregates(pNC, pItem->pExpr);
    }
  }
}